

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::SimpleDateFormat::matchQuarterString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,Calendar *cal)

{
  int32_t iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int32_t iVar5;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  if (dataCount < 1) {
    iVar3 = -1;
    iVar5 = 0;
  }
  else {
    uVar2 = 0;
    uVar4 = 0xffffffff;
    iVar5 = 0;
    do {
      iVar1 = matchStringWithOptionalDot(text,start,data);
      if (iVar5 < iVar1) {
        uVar4 = uVar2 & 0xffffffff;
        iVar5 = iVar1;
      }
      iVar3 = (int)uVar4;
      uVar2 = uVar2 + 1;
      data = data + 1;
    } while ((uint)dataCount != uVar2);
  }
  if (iVar3 < 0) {
    iVar5 = -start;
  }
  else {
    Calendar::set(cal,field,iVar3 * 3);
    iVar5 = iVar5 + start;
  }
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return iVar5;
}

Assistant:

int32_t SimpleDateFormat::matchQuarterString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;

    for (; i < count; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        cal.set(field, bestMatch * 3);
        return start + bestMatchLength;
    }

    return -start;
}